

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_36::HttpOutputStream::writeBodyData
          (HttpOutputStream *this,ArrayPtr<const_unsigned_char> buffer)

{
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  undefined8 *puVar1;
  SourceLocation location;
  Coroutine<void> *coroutine;
  bool bVar2;
  coroutine_handle<void> handle;
  undefined8 in_RCX;
  PromiseBase PVar3;
  uchar *puVar4;
  PromiseAwaiter<void> *__return_storage_ptr__;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Fault local_60;
  char *local_58;
  char *pcStack_50;
  _func_int **local_48;
  Coroutine<void> *local_40;
  OwnPromiseNode local_38;
  
  puVar4 = buffer.ptr;
  handle._M_fr_ptr = operator_new(0x628);
  *(code **)handle._M_fr_ptr = writeBodyData;
  *(code **)((long)handle._M_fr_ptr + 8) = writeBodyData;
  *(undefined8 *)((long)handle._M_fr_ptr + 0x618) = in_RCX;
  *(size_t *)((long)handle._M_fr_ptr + 0x610) = buffer.size_;
  *(uchar **)((long)handle._M_fr_ptr + 0x608) = puVar4;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "writeBodyData";
  local_48 = (_func_int **)0x15000008e6;
  location.function = "writeBodyData";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x8e6;
  location.columnNumber = 0x15;
  kj::_::Coroutine<void>::Coroutine
            ((Coroutine<void> *)((long)handle._M_fr_ptr + 0x10),handle,location);
  local_40 = (Coroutine<void> *)((long)handle._M_fr_ptr + 0x10);
  local_38.ptr = (PromiseNode *)this;
  kj::_::Coroutine<void>::get_return_object((Coroutine<void> *)this);
  coroutine = local_40;
  local_60.exception._0_1_ = puVar4[0x1a] ^ 1;
  if (puVar4[0x1a] != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[32]>
              ((Fault *)&stack0xffffffffffffffa8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x8e7,FAILED,"!writeInProgress","_kjCondition,\"concurrent write()s not allowed\"",
               (DebugExpression<bool> *)&local_60,(char (*) [32])"concurrent write()s not allowed");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffffa8);
  }
  local_58 = (char *)(puVar4 + 0x18);
  if (puVar4[0x18] != '\0') {
    this_00 = (Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x5f0);
    puVar4[0x1a] = '\x01';
    *(char **)((long)handle._M_fr_ptr + 0x5d8) =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    *(char **)((long)handle._M_fr_ptr + 0x5e0) = "writeBodyData";
    *(undefined8 *)((long)handle._M_fr_ptr + 0x5e8) = 0x11000008eb;
    Promise<void>::fork((Promise<void> *)this_00);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffa8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(puVar4 + 0x10),
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffa8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffa8);
    PVar3.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_38.ptr;
    kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
              ((ForkedPromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238),
               (ForkedPromise<void> *)this_00);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x620) = 0;
    bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)((long)handle._M_fr_ptr + 0x268),
                       &coroutine->super_CoroutineBase);
    if (!bVar2) {
      kj::_::PromiseAwaiter<void>::await_resume
                ((PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x268));
      kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter
                ((ForkedPromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238));
      this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x600);
      puVar1 = *(undefined8 **)(*(long *)((long)handle._M_fr_ptr + 0x608) + 8);
      (**(code **)*puVar1)
                (this_01,puVar1,*(undefined8 *)((long)handle._M_fr_ptr + 0x610),
                 *(undefined8 *)((long)handle._M_fr_ptr + 0x618));
      __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x420);
      co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x620) = 1;
      bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,
                         &coroutine->super_CoroutineBase);
      if (!bVar2) {
        kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
        kj::_::PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
        *(undefined1 *)(*(long *)((long)handle._M_fr_ptr + 0x608) + 0x1a) = 0;
        Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(this_00);
        kj::_::CoroutineMixin<kj::_::Coroutine<void>,_void>::return_void
                  ((CoroutineMixin<kj::_::Coroutine<void>,_void> *)coroutine);
        *(undefined8 *)handle._M_fr_ptr = 0;
        *(undefined1 *)((long)handle._M_fr_ptr + 0x620) = 2;
        PVar3.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_38.ptr;
      }
    }
    return (Promise<void>)(PromiseNode *)PVar3.node.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x8e8,FAILED,"inBody","_kjCondition,",
             (DebugExpression<bool_&> *)&stack0xffffffffffffffa8);
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

kj::Promise<void> writeBodyData(ArrayPtr<const byte> buffer) {
    KJ_REQUIRE(!writeInProgress, "concurrent write()s not allowed");
    KJ_REQUIRE(inBody);

    writeInProgress = true;
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();

    co_await fork;
    co_await inner.write(buffer);

    // We intentionally don't use KJ_DEFER to clean this up because if an exception is thrown, we
    // want to block further writes.
    writeInProgress = false;
  }